

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SPIREntryPoint::SPIREntryPoint
          (SPIREntryPoint *this,FunctionID self_,ExecutionModel execution_model,string *entry_name)

{
  (this->self).id = self_.id;
  ::std::__cxx11::string::string((string *)&this->name,(string *)entry_name);
  ::std::__cxx11::string::string((string *)&this->orig_name,(string *)entry_name);
  (this->interface_variables).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.buffer_size = 0;
  (this->interface_variables).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)2> *)&(this->interface_variables).stack_storage;
  (this->interface_variables).buffer_capacity = 8;
  (this->flags).lower = 0;
  (this->flags).higher._M_h._M_buckets = &(this->flags).higher._M_h._M_single_bucket;
  (this->flags).higher._M_h._M_bucket_count = 1;
  (this->flags).higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flags).higher._M_h._M_element_count = 0;
  (this->flags).higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flags).higher._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flags).higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->output_vertices = 0;
  this->output_primitives = 0;
  (this->workgroup_size).x = 0;
  (this->workgroup_size).y = 0;
  (this->workgroup_size).z = 0;
  (this->workgroup_size).id_x = 0;
  (this->workgroup_size).id_y = 0;
  (this->workgroup_size).id_z = 0;
  *(undefined8 *)&(this->workgroup_size).constant = 0;
  this->model = execution_model;
  this->geometry_passthrough = false;
  return;
}

Assistant:

SPIREntryPoint(FunctionID self_, spv::ExecutionModel execution_model, const std::string &entry_name)
	    : self(self_)
	    , name(entry_name)
	    , orig_name(entry_name)
	    , model(execution_model)
	{
	}